

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

ostream * operator<<(ostream *o,span<unsigned_short> *d)

{
  ulong uVar1;
  unsigned_short *puVar2;
  ostream *this;
  long lVar3;
  
  uVar1 = d->_len;
  if (1 < uVar1) {
    puVar2 = d->_base;
    lVar3 = 0;
    this = o;
    while( true ) {
      std::ostream::operator<<(this,*(ushort *)((long)puVar2 + lVar3));
      if ((uVar1 & 0xfffffffffffffffe) - 2 == lVar3) break;
      this = std::operator<<(o,' ');
      lVar3 = lVar3 + 2;
    }
  }
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const mpt::span<T> &d)
{
	typename mpt::span<T>::iterator begin = d.begin(), end = d.end();
	if (begin == end) {
		return o;
	}
	o << *begin;
	while (++begin != end) {
		o << ' ' << *begin;
	}
	return o;
}